

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool find_space(loc *centre,wchar_t height,wchar_t width)

{
  wchar_t wVar1;
  wchar_t wVar2;
  loc_conflict *plVar3;
  int iVar4;
  _Bool _Var5;
  wchar_t by1_00;
  wchar_t bx1_00;
  wchar_t by2_00;
  wchar_t bx2_00;
  wchar_t blocks_wide;
  wchar_t blocks_high;
  wchar_t bx2;
  wchar_t by2;
  wchar_t bx1;
  wchar_t by1;
  wchar_t i;
  wchar_t width_local;
  wchar_t height_local;
  loc *centre_local;
  
  wVar1 = dun->block_hgt;
  wVar2 = dun->block_wid;
  bx1 = L'\0';
  while( true ) {
    if (L'\x18' < bx1) {
      return false;
    }
    by1_00 = Rand_div(dun->row_blocks);
    bx1_00 = Rand_div(dun->col_blocks);
    by2_00 = by1_00 + (height + L'\xffffffff') / wVar1;
    bx2_00 = bx1_00 + (width + L'\xffffffff') / wVar2;
    _Var5 = check_for_unreserved_blocks(by1_00,bx1_00,by2_00,bx2_00);
    if (_Var5) break;
    bx1 = bx1 + L'\x01';
  }
  centre->y = ((by1_00 + by2_00 + 1) * dun->block_hgt) / 2;
  centre->x = ((bx1_00 + bx2_00 + 1) * dun->block_wid) / 2;
  if (dun->cent_n < (int)(uint)z_info->level_room_max) {
    plVar3 = dun->cent;
    wVar1 = dun->cent_n;
    iVar4 = centre->y;
    plVar3[wVar1].x = centre->x;
    plVar3[wVar1].y = iVar4;
    dun->cent_n = dun->cent_n + L'\x01';
  }
  reserve_blocks(by1_00,bx1_00,by2_00,bx2_00);
  return true;
}

Assistant:

static bool find_space(struct loc *centre, int height, int width)
{
	int i;
	int by1, bx1, by2, bx2;

	/* Find out how many blocks we need. */
	int blocks_high = 1 + ((height - 1) / dun->block_hgt);
	int blocks_wide = 1 + ((width - 1) / dun->block_wid);

	/* We'll allow twenty-five guesses. */
	for (i = 0; i < 25; i++) {
		/* Pick a top left block at random */
		by1 = randint0(dun->row_blocks);
		bx1 = randint0(dun->col_blocks);

		/* Extract bottom right corner block */
		by2 = by1 + blocks_high - 1;
		bx2 = bx1 + blocks_wide - 1;

		if (!check_for_unreserved_blocks(by1, bx1, by2, bx2)) continue;

		/* Get the location of the room */
		centre->y = ((by1 + by2 + 1) * dun->block_hgt) / 2;
		centre->x = ((bx1 + bx2 + 1) * dun->block_wid) / 2;

		/* Save the room location */
		if (dun->cent_n < z_info->level_room_max) {
			dun->cent[dun->cent_n] = *centre;
			dun->cent_n++;
		}

		reserve_blocks(by1, bx1, by2, bx2);

		/* Success. */
		return (true);
	}

	/* Failure. */
	return (false);
}